

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O0

void __thiscall Conversion::setVocab(Conversion *this,string *vocab)

{
  ulong uVar1;
  key_type *__k;
  mapped_type *pmVar2;
  int local_1c;
  int i;
  string *vocab_local;
  Conversion *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)vocab);
  local_1c = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= (ulong)(long)local_1c) break;
    __k = (key_type *)std::__cxx11::string::operator[]((ulong)vocab);
    pmVar2 = std::
             map<char,_long_long,_std::less<char>,_std::allocator<std::pair<const_char,_long_long>_>_>
             ::operator[](&this->charToIndex,__k);
    *pmVar2 = (long)(char)local_1c;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Conversion::setVocab(string vocab) {
    this->indexToChar = vocab;
    for (int i = 0; i < vocab.size(); i++) {
        charToIndex[vocab[i]] = static_cast<char>(i);
    }
}